

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fq.cpp
# Opt level: O0

bool __thiscall zmq::fq_t::has_in(fq_t *this)

{
  bool bVar1;
  array_t<zmq::pipe_t,_1> *in_RDI;
  size_type in_stack_00000010;
  size_type in_stack_00000018;
  array_t<zmq::pipe_t,_1> *in_stack_00000020;
  pipe_t *in_stack_00000038;
  array_t<zmq::pipe_t,_1> *this_00;
  bool local_1;
  
  this_00 = in_RDI;
  if (((ulong)in_RDI[2]._items.super__Vector_base<zmq::pipe_t_*,_std::allocator<zmq::pipe_t_*>_>.
              _M_impl.super__Vector_impl_data._M_start & 1) == 0) {
    while (in_RDI[1]._items.super__Vector_base<zmq::pipe_t_*,_std::allocator<zmq::pipe_t_*>_>.
           _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      array_t<zmq::pipe_t,_1>::operator[](this_00,(size_type)in_RDI);
      bVar1 = pipe_t::check_read(in_stack_00000038);
      if (bVar1) {
        return true;
      }
      in_RDI[1]._items.super__Vector_base<zmq::pipe_t_*,_std::allocator<zmq::pipe_t_*>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)((long)in_RDI[1]._items.
                           super__Vector_base<zmq::pipe_t_*,_std::allocator<zmq::pipe_t_*>_>._M_impl
                           .super__Vector_impl_data._M_start + -1);
      array_t<zmq::pipe_t,_1>::swap(in_stack_00000020,in_stack_00000018,in_stack_00000010);
      if (in_RDI[1]._items.super__Vector_base<zmq::pipe_t_*,_std::allocator<zmq::pipe_t_*>_>._M_impl
          .super__Vector_impl_data._M_end_of_storage ==
          in_RDI[1]._items.super__Vector_base<zmq::pipe_t_*,_std::allocator<zmq::pipe_t_*>_>._M_impl
          .super__Vector_impl_data._M_start) {
        in_RDI[1]._items.super__Vector_base<zmq::pipe_t_*,_std::allocator<zmq::pipe_t_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      }
    }
    local_1 = false;
  }
  else {
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool zmq::fq_t::has_in ()
{
    //  There are subsequent parts of the partly-read message available.
    if (_more)
        return true;

    //  Note that messing with current doesn't break the fairness of fair
    //  queueing algorithm. If there are no messages available current will
    //  get back to its original value. Otherwise it'll point to the first
    //  pipe holding messages, skipping only pipes with no messages available.
    while (_active > 0) {
        if (_pipes[_current]->check_read ())
            return true;

        //  Deactivate the pipe.
        _active--;
        _pipes.swap (_current, _active);
        if (_current == _active)
            _current = 0;
    }

    return false;
}